

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::
SmallVectorBase<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
::
emplaceRealloc<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
          (SmallVectorBase<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
           *this,pointer pos,
          span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *args)

{
  ulong uVar1;
  size_t sVar2;
  span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *__cur_1;
  undefined8 *puVar3;
  pointer psVar4;
  undefined8 *puVar5;
  pointer psVar6;
  EVP_PKEY_CTX *pEVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar7 = (EVP_PKEY_CTX *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar7 < ctx) {
    pEVar7 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar7 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar8 = (long)pos - *(long *)this;
  puVar3 = (undefined8 *)operator_new((long)pEVar7 << 4);
  sVar2 = (args->_M_extent)._M_extent_value;
  *(undefined8 *)((long)puVar3 + lVar8) = args->_M_ptr;
  ((undefined8 *)((long)puVar3 + lVar8))[1] = sVar2;
  psVar6 = *(pointer *)this;
  psVar4 = psVar6 + *(long *)(this + 8);
  puVar5 = puVar3;
  if (psVar4 == pos) {
    for (; psVar6 != pos; psVar6 = psVar6 + 1) {
      sVar2 = (psVar6->_M_extent)._M_extent_value;
      *puVar5 = psVar6->_M_ptr;
      puVar5[1] = sVar2;
      puVar5 = puVar5 + 2;
    }
  }
  else {
    for (; psVar6 != pos; psVar6 = psVar6 + 1) {
      sVar2 = (psVar6->_M_extent)._M_extent_value;
      *puVar5 = psVar6->_M_ptr;
      puVar5[1] = sVar2;
      puVar5 = puVar5 + 2;
    }
    puVar5 = (undefined8 *)(lVar8 + (long)puVar3);
    for (; pos != psVar4; pos = pos + 1) {
      sVar2 = (pos->_M_extent)._M_extent_value;
      puVar5[2] = pos->_M_ptr;
      puVar5[3] = sVar2;
      puVar5 = puVar5 + 2;
    }
  }
  SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
  ::cleanup((SmallVectorBase<std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
             *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(EVP_PKEY_CTX **)(this + 0x10) = pEVar7;
  *(undefined8 **)this = puVar3;
  return (pointer)((long)puVar3 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}